

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::rehash(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  raw_node *prVar2;
  node *pNode_end;
  node *pNode;
  undefined1 local_38 [8];
  hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
  new_map;
  uint new_hash_size_local;
  hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
  *this_local;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (new_map.m_grow_threshold = new_hash_size,
     uVar1 = vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
             ::size(&this->m_values), new_hash_size != uVar1)) {
    hash_map((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
              *)local_38);
    vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
    ::resize((vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
              *)local_38,new_map.m_grow_threshold,false);
    uVar1 = math::floor_log2i(new_map.m_grow_threshold);
    new_map.m_values.m_size = 0x20 - uVar1;
    new_map._20_4_ = 0xffffffff;
    pNode_end = (node *)vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
                        ::begin(&this->m_values);
    uVar1 = vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
            ::size(&this->m_values);
    prVar2 = (raw_node *)pNode_end + uVar1;
    while (((raw_node *)pNode_end != prVar2 &&
           (((pNode_end->super_value_type).field_0x41 == '\0' ||
            (move_into((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                        *)local_38,pNode_end), new_map.m_hash_shift != this->m_num_valid))))) {
      pNode_end = pNode_end + 1;
    }
    new_map._20_4_ = new_map.m_grow_threshold + 1 >> 1;
    vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
    ::clear_no_destruction(&this->m_values);
    this->m_hash_shift = 0x20;
    swap(this,(hash_map_type *)local_38);
    ~hash_map((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
               *)local_38);
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }